

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O1

err_t btokCVCMatch(octet *cert,size_t cert_len,octet *privkey,size_t privkey_len)

{
  err_t eVar1;
  btok_cvc_t *cvc;
  
  cvc = (btok_cvc_t *)blobCreate(0x128);
  if (cvc == (btok_cvc_t *)0x0) {
    eVar1 = 0x6e;
  }
  else {
    eVar1 = btokCVCUnwrap(cvc,cert,cert_len,(octet *)0x0,0);
    if (eVar1 == 0) {
      eVar1 = btokKeypairVal(privkey,privkey_len,cvc->pubkey,cvc->pubkey_len);
    }
    blobClose(cvc);
  }
  return eVar1;
}

Assistant:

err_t btokCVCMatch(const octet cert[], size_t cert_len, const octet privkey[],
	size_t privkey_len)
{
	err_t code;
	btok_cvc_t* cvc;
	// выделить память
	cvc = (btok_cvc_t*)blobCreate(sizeof(btok_cvc_t));
	if (!cvc)
		return ERR_OUTOFMEMORY;
	// разобрать сертификат
	code = btokCVCUnwrap(cvc, cert, cert_len, 0, 0);
	ERR_CALL_HANDLE(code, blobClose(cvc));
	// проверить соответствие
	code = btokKeypairVal(privkey, privkey_len, cvc->pubkey, cvc->pubkey_len);
	// завершить
	blobClose(cvc);
	return code;
}